

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph.h
# Opt level: O0

uint32_t pgraph_pitch_mask(chipset_info *chipset)

{
  chipset_info *chipset_local;
  
  if (chipset->card_type < 0x10) {
    chipset_local._4_4_ = 0x1ff0;
  }
  else if ((chipset->card_type < 0x20) || (chipset->chipset == 0x34)) {
    chipset_local._4_4_ = 0xfff0;
  }
  else if (chipset->card_type < 0x40) {
    chipset_local._4_4_ = 0xffc0;
  }
  else {
    chipset_local._4_4_ = 0x1ffc0;
  }
  return chipset_local._4_4_;
}

Assistant:

static inline uint32_t pgraph_pitch_mask(const struct chipset_info *chipset) {
	if (chipset->card_type < 0x10)
		return 0x1ff0;
	else if (chipset->card_type < 0x20 || chipset->chipset == 0x34)
		return 0xfff0;
	else if (chipset->card_type < 0x40)
		return 0xffc0;
	else
		return 0x1ffc0;
}